

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

void Gia_SimAbsSolve(Gia_SimAbsMan_t *p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Vec_Wrd_t *pVVar4;
  word *pwVar5;
  int *piVar6;
  int *piVar7;
  int iVar8;
  uint uVar9;
  word *pwVar10;
  Vec_Int_t *pVVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  int Count;
  int iVar16;
  int iVar17;
  int w;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  word *__s;
  timespec ts;
  int local_60;
  timespec local_50;
  long local_40;
  long local_38;
  
  iVar8 = clock_gettime(3,&local_50);
  if (iVar8 < 0) {
    lVar14 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  iVar8 = p->vPatPairs->nSize;
  uVar12 = iVar8 - (iVar8 >> 0x1f);
  iVar8 = (((int)uVar12 >> 7) + 1) - (uint)((uVar12 >> 1 & 0x3f) == 0);
  pVVar4 = p->vCoverTable;
  p->nWordsTable = iVar8;
  uVar22 = (long)iVar8 * ((long)p->nCands + 1);
  iVar8 = (int)uVar22;
  if (pVVar4->nCap < iVar8) {
    if (pVVar4->pArray == (word *)0x0) {
      pwVar10 = (word *)malloc(uVar22 * 8);
    }
    else {
      pwVar10 = (word *)realloc(pVVar4->pArray,uVar22 * 8);
    }
    pVVar4->pArray = pwVar10;
    if (pwVar10 == (word *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                    ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
    }
    pVVar4->nCap = iVar8;
  }
  if (0 < iVar8) {
    memset(pVVar4->pArray,0,(uVar22 & 0xffffffff) << 3);
  }
  pVVar4->nSize = iVar8;
  uVar12 = p->nCands;
  uVar1 = p->nWordsTable;
  uVar22 = (ulong)uVar1;
  uVar9 = uVar12 * uVar1;
  if ((int)uVar9 < 0) {
LAB_007d6c30:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                  ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
  }
  uVar2 = p->vCoverTable->nSize;
  uVar13 = (ulong)uVar2;
  if ((int)uVar2 <= (int)uVar9) goto LAB_007d6c30;
  pwVar10 = p->vCoverTable->pArray;
  __s = pwVar10 + uVar9;
  p->pTableTemp = __s;
  if (0 < (int)uVar12) {
    local_38 = (long)(int)uVar1;
    pVVar4 = p->vSims;
    local_40 = (long)p->nWords;
    uVar18 = 0;
    do {
      lVar20 = uVar18 * local_40;
      if (((lVar20 < 0) || (pVVar4->nSize <= lVar20)) || (uVar13 <= uVar18 * local_38))
      goto LAB_007d6c30;
      iVar8 = p->vPatPairs->nSize;
      uVar15 = 0;
      if (1 < iVar8) {
        pwVar5 = pVVar4->pArray;
        piVar6 = p->vPatPairs->pArray;
        pVVar11 = p->vValues;
        uVar15 = 0;
        do {
          uVar9 = piVar6[uVar15];
          if (((int)uVar9 < 0) || (uVar2 = pVVar11->nSize, (int)uVar2 <= (int)uVar9)) {
LAB_007d6bd3:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          piVar7 = pVVar11->pArray;
          if (piVar7[uVar9] != 0) {
            __assert_fail("Vec_IntEntry(p->vValues, iPat) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                          ,0x49f,"void Gia_SimAbsSolve(Gia_SimAbsMan_t *)");
          }
          uVar3 = piVar6[uVar15 + 1];
          if (((int)uVar3 < 0) || (uVar2 <= uVar3)) goto LAB_007d6bd3;
          if (piVar7[uVar3] != 1) {
            __assert_fail("Vec_IntEntry(p->vValues, iPat2) == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                          ,0x4a0,"void Gia_SimAbsSolve(Gia_SimAbsMan_t *)");
          }
          if ((((uint)(pwVar5[lVar20 + (ulong)(uVar3 >> 6)] >> ((byte)uVar3 & 0x3f)) ^
               (uint)(pwVar5[lVar20 + (ulong)(uVar9 >> 6)] >> ((byte)uVar9 & 0x3f))) & 1) != 0) {
            pwVar10[uVar18 * local_38 + (uVar15 >> 7 & 0x1ffffff)] =
                 pwVar10[uVar18 * local_38 + (uVar15 >> 7 & 0x1ffffff)] ^
                 1L << ((byte)((uVar15 & 0xffffffff) >> 1) & 0x3f);
          }
          uVar15 = uVar15 + 2;
        } while ((int)((uint)uVar15 | 1) < iVar8);
      }
      if ((int)uVar15 != iVar8) {
        __assert_fail("k == Vec_IntSize(p->vPatPairs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                      ,0x4a4,"void Gia_SimAbsSolve(Gia_SimAbsMan_t *)");
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar12);
  }
  p->vResub->nSize = 0;
  if (0 < (int)uVar1) {
    memset(__s,0,uVar22 * 8);
  }
  iVar8 = p->vPatPairs->nSize;
  if (1 < iVar8) {
    uVar18 = 0;
    do {
      __s[uVar18 >> 6] = __s[uVar18 >> 6] ^ 1L << ((byte)uVar18 & 0x3f);
      uVar12 = (int)uVar18 + 1;
      uVar18 = (ulong)uVar12;
    } while (iVar8 / 2 != uVar12);
  }
  while (0 < (int)uVar1) {
    uVar18 = 0;
    while (__s[uVar18] == 0) {
      uVar18 = uVar18 + 1;
      if (uVar22 == uVar18) goto LAB_007d6aa5;
    }
    if ((long)p->nCands < 1) {
      iVar8 = -1;
    }
    else {
      iVar16 = -1;
      uVar15 = 0;
      uVar18 = 0xffffffff;
      do {
        local_60 = (int)uVar13;
        if (local_60 <= (int)uVar15 * (int)uVar22) goto LAB_007d6c30;
        uVar19 = 0;
        iVar17 = 0;
        do {
          uVar21 = (pwVar10[uVar19] & __s[uVar19]) -
                   ((pwVar10[uVar19] & __s[uVar19]) >> 1 & 0x5555555555555555);
          uVar21 = (uVar21 >> 2 & 0x3333333333333333) + (uVar21 & 0x3333333333333333);
          uVar21 = (uVar21 >> 4) + uVar21 & 0xf0f0f0f0f0f0f0f;
          uVar21 = (uVar21 >> 8) + uVar21;
          lVar20 = (uVar21 >> 0x10) + uVar21;
          iVar17 = iVar17 + ((int)((ulong)lVar20 >> 0x20) + (int)lVar20 & 0xffU);
          uVar19 = uVar19 + 1;
        } while (uVar22 != uVar19);
        if (iVar16 < iVar17) {
          uVar18 = uVar15 & 0xffffffff;
        }
        iVar8 = (int)uVar18;
        if (iVar16 <= iVar17) {
          iVar16 = iVar17;
        }
        uVar15 = uVar15 + 1;
        pwVar10 = pwVar10 + uVar22;
      } while (uVar15 != (long)p->nCands);
    }
    Vec_IntPush(p->vResub,iVar8);
    uVar1 = p->nWordsTable;
    uVar22 = (ulong)uVar1;
    uVar12 = iVar8 * uVar1;
    if ((int)uVar12 < 0) goto LAB_007d6c30;
    uVar9 = p->vCoverTable->nSize;
    uVar13 = (ulong)uVar9;
    if ((int)uVar9 <= (int)uVar12) goto LAB_007d6c30;
    if ((int)uVar1 < 1) break;
    pwVar10 = p->vCoverTable->pArray;
    __s = p->pTableTemp;
    uVar18 = 0;
    do {
      __s[uVar18] = __s[uVar18] & ~pwVar10[uVar12 + uVar18];
      uVar18 = uVar18 + 1;
    } while (uVar22 != uVar18);
  }
LAB_007d6aa5:
  if (p->fVerbose == 0) {
    return;
  }
  uVar22 = 0;
  printf("Solution %2d for covering problem [%5d x %5d]: ",(ulong)(uint)p->vResub->nSize,
         (ulong)(uint)(p->vPatPairs->nSize / 2),(ulong)(uint)p->nCands);
  pVVar11 = p->vResub;
  if (0 < pVVar11->nSize) {
    uVar22 = 0;
    do {
      uVar13 = uVar22;
      printf("%6d ",(ulong)(uint)pVVar11->pArray[uVar13]);
      uVar22 = uVar13 + 1;
      pVVar11 = p->vResub;
    } while ((long)uVar22 < (long)pVVar11->nSize);
    if (10 < uVar13) goto LAB_007d6b36;
  }
  iVar8 = (int)uVar22 + -0xc;
  do {
    printf("       ");
    iVar8 = iVar8 + 1;
  } while (iVar8 != 0);
LAB_007d6b36:
  printf("   ");
  iVar16 = 3;
  iVar8 = clock_gettime(3,&local_50);
  if (iVar8 < 0) {
    lVar20 = -1;
  }
  else {
    lVar20 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  Abc_Print(iVar16,"%s =","Time");
  Abc_Print(iVar16,"%9.2f sec\n",(double)(lVar20 + lVar14) / 1000000.0);
  return;
}

Assistant:

void Gia_SimAbsSolve( Gia_SimAbsMan_t * p )
{
    abctime clk = Abc_Clock();
    int i, k, iPat, iPat2;
/*
    Vec_Int_t * vSimPats = Vec_IntDup( p->vPatPairs );
    Vec_IntUniqify( vSimPats );
    printf( "Selected %d pattern pairs contain %d unique patterns.\n", Vec_IntSize(p->vPatPairs)/2, Vec_IntSize(vSimPats) );
    Vec_IntFree( vSimPats );
*/
    // set up the covering problem
    p->nWordsTable = Abc_Bit6WordNum( Vec_IntSize(p->vPatPairs)/2 );
    Vec_WrdFill( p->vCoverTable, p->nWordsTable * (p->nCands + 1), 0 );
    p->pTableTemp = Vec_WrdEntryP( p->vCoverTable, p->nWordsTable * p->nCands );
    for ( i = 0; i < p->nCands; i++ )
    {
        word * pSimCand  = Vec_WrdEntryP( p->vSims, p->nWords * i );
        word * pSimTable = Vec_WrdEntryP( p->vCoverTable, p->nWordsTable * i );
        //printf( "%4d : ", i );
        //Extra_PrintBinary( stdout, (word *)pSimCand, p->nCands );  printf( "\n" );
        Vec_IntForEachEntryDouble( p->vPatPairs, iPat, iPat2, k )
        {
            assert( Vec_IntEntry(p->vValues, iPat)  == 0 );
            assert( Vec_IntEntry(p->vValues, iPat2) == 1 );
            if ( Abc_TtGetBit(pSimCand, iPat) != Abc_TtGetBit(pSimCand, iPat2) )
                Abc_TtXorBit(pSimTable, k/2);
        }
        assert( k == Vec_IntSize(p->vPatPairs) );
    }

    if ( 0 )
    {
        printf( "                  " );
        for ( i = 0; i < p->nCands; i++ )
            printf( "%d", i % 10 );
        printf( "\n" );

        Vec_IntForEachEntryDouble( p->vPatPairs, iPat, iPat2, i )
        {
            printf( "%4d  ", i/2 );
            printf( "%4d  ", iPat );
            printf( "%4d  ", iPat2 );
            for ( k = 0; k < p->nCands; k++ )
            {
                word * pSimTable = Vec_WrdEntryP( p->vCoverTable, p->nWordsTable * k );
                printf( "%c", Abc_TtGetBit(pSimTable, i/2) ? '*' : ' ' );
            }
            printf( "\n" );
        }
    }

    //Gia_SimAbsCheckSolution(p);

    Vec_IntClear( p->vResub );
    Abc_TtClear( p->pTableTemp, p->nWordsTable );
    for ( i = 0; i < Vec_IntSize(p->vPatPairs)/2; i++ )
        Abc_TtXorBit( p->pTableTemp, i );

    while ( !Abc_TtIsConst0(p->pTableTemp, p->nWordsTable) )
    {
        word * pSimTable;
        int iArgMax = -1, CostThis, CostMax = -1;
        // compute the cost of each column
        for ( i = 0; i < p->nCands; i++ )
        {
            pSimTable = Vec_WrdEntryP( p->vCoverTable, p->nWordsTable * i );
            CostThis = Abc_TtCountOnesVecMask( pSimTable, p->pTableTemp, p->nWordsTable, 0 );
            if ( CostMax >= CostThis )
                continue;
            CostMax = CostThis;
            iArgMax = i;
        }
        // find the best column
        Vec_IntPush( p->vResub, iArgMax );
        // delete values of this column
        pSimTable = Vec_WrdEntryP( p->vCoverTable, p->nWordsTable * iArgMax );
        Abc_TtSharp( p->pTableTemp, p->pTableTemp, pSimTable, p->nWordsTable );
    }
    if ( p->fVerbose )
    {
        printf( "Solution %2d for covering problem [%5d x %5d]: ", Vec_IntSize(p->vResub), Vec_IntSize(p->vPatPairs)/2, p->nCands );
        Vec_IntForEachEntry( p->vResub, iPat, i )
            printf( "%6d ", iPat );
        for ( ; i < 12; i++ )
            printf( "       " );
        printf( "   " );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
}